

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

int Abc_NtkResubstitute(Abc_Ntk_t *pNtk,int nCutMax,int nStepsMax,int nLevelsOdc,int fUpdateLevel,
                       int fVerbose,int fVeryVerbose)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char cVar6;
  undefined4 uVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  long lVar11;
  Abc_ManRes_t *pAVar12;
  Odc_Man_t *p;
  int iVar13;
  uint *puDataR;
  Abc_ManRes_t *pAVar14;
  Vec_Ptr_t *pVVar15;
  void **ppvVar16;
  uint *puVar17;
  ulong uVar18;
  ProgressBar *p_00;
  int *piVar19;
  Dec_Graph_t *pGraph_00;
  abctime aVar20;
  abctime aVar21;
  uint uVar22;
  int iVar23;
  int Fill;
  size_t __n;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  Vec_Ptr_t *pVVar24;
  Abc_Obj_t *pObj1;
  long lVar25;
  long lVar26;
  void *pvVar27;
  long lVar28;
  Abc_Obj_t *pAVar29;
  ulong uVar30;
  Abc_Obj_t *pAVar31;
  char *__assertion;
  Abc_Ntk_t *pAVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  void *pvVar37;
  uint uVar38;
  Dec_Graph_t *pGraph;
  Vec_Ptr_t *pVVar39;
  timespec local_d0;
  Vec_Ptr_t *local_c0;
  Abc_Obj_t *local_b8;
  int *local_b0;
  Abc_Ntk_t *local_a8;
  Abc_ManRes_t *local_a0;
  uint local_94;
  size_t local_90;
  int local_84;
  ProgressBar *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  Odc_Man_t *local_60;
  long local_58;
  long local_50;
  Abc_ManCut_t *local_48;
  long local_40;
  long local_38;
  
  local_c0 = (Vec_Ptr_t *)CONCAT44(local_c0._4_4_,nLevelsOdc);
  local_a8 = pNtk;
  local_94 = nStepsMax;
  local_84 = fUpdateLevel;
  local_74 = fVerbose;
  iVar13 = clock_gettime(3,&local_d0);
  if (iVar13 < 0) {
    local_68 = -1;
  }
  else {
    local_68 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
  }
  if (local_a8->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x96,"int Abc_NtkResubstitute(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)local_a8->pManFunc);
  local_48 = Abc_NtkManCutStart(nCutMax,100000,100000,100000);
  pAVar14 = (Abc_ManRes_t *)calloc(1,0x128);
  pAVar14->nLeavesMax = nCutMax;
  pAVar14->nDivsMax = 0x96;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  lVar25 = 0x96;
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs = pVVar15;
  uVar38 = 1 << ((byte)nCutMax & 0x1f);
  uVar22 = uVar38 >> 5;
  if ((int)uVar38 < 0x21) {
    uVar22 = 1;
  }
  pAVar14->nBits = uVar38;
  pAVar14->nWords = uVar22;
  puVar17 = (uint *)malloc((ulong)(uVar22 * 0x97) << 2);
  pAVar14->pInfo = puVar17;
  __n = (size_t)(uVar22 * 4);
  local_b8 = (Abc_Obj_t *)CONCAT44(local_b8._4_4_,nCutMax);
  lVar26 = 0;
  local_b0 = (int *)(ulong)uVar22;
  memset(puVar17,0,(long)nCutMax * __n);
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vSims = pVVar15;
  local_a0 = pAVar14;
  local_90 = __n;
  do {
    pVVar15 = local_a0->vSims;
    puVar17 = local_a0->pInfo;
    uVar22 = pVVar15->nSize;
    if (uVar22 == pVVar15->nCap) {
      if ((int)uVar22 < 0x10) {
        if (pVVar15->pArray == (void **)0x0) {
          ppvVar16 = (void **)malloc(0x80);
        }
        else {
          ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
        }
        pVVar15->pArray = ppvVar16;
        pVVar15->nCap = 0x10;
        __n = local_90;
      }
      else {
        if (pVVar15->pArray == (void **)0x0) {
          ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
        }
        else {
          ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar22 << 4);
        }
        pVVar15->pArray = ppvVar16;
        pVVar15->nCap = uVar22 * 2;
        __n = local_90;
      }
    }
    else {
      ppvVar16 = pVVar15->pArray;
    }
    pAVar14 = local_a0;
    iVar13 = pVVar15->nSize;
    pVVar15->nSize = iVar13 + 1;
    ppvVar16[iVar13] = (void *)((long)puVar17 + lVar26);
    lVar26 = lVar26 + __n;
    lVar25 = lVar25 + -1;
  } while (lVar25 != 0);
  local_a0->pCareSet = local_a0->pInfo + (uint)((int)local_b0 * 0x96);
  memset(local_a0->pInfo + (uint)((int)local_b0 * 0x96),0xff,__n);
  iVar13 = (int)local_b8;
  if (0 < (int)local_b8) {
    ppvVar16 = pAVar14->vSims->pArray;
    if ((int)uVar38 < 2) {
      uVar38 = 1;
    }
    uVar18 = 0;
    do {
      if ((int)local_b8 != 0x1f) {
        pvVar37 = ppvVar16[uVar18];
        uVar30 = 0;
        do {
          if (((uint)uVar30 & 1 << ((byte)uVar18 & 0x1f)) != 0) {
            puVar17 = (uint *)((long)pvVar37 + (uVar30 >> 5) * 4);
            *puVar17 = *puVar17 | 1 << ((byte)uVar30 & 0x1f);
          }
          uVar22 = (uint)uVar30 + 1;
          uVar30 = (ulong)uVar22;
        } while (uVar38 != uVar22);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != ((ulong)local_b8 & 0xffffffff));
  }
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs1UP = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs1UN = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs1B = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs2UP0 = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs2UP1 = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs2UN0 = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vDivs2UN1 = pVVar15;
  pVVar15 = (Vec_Ptr_t *)malloc(0x10);
  pVVar15->nCap = 0x96;
  pVVar15->nSize = 0;
  ppvVar16 = (void **)malloc(0x4b0);
  pVVar15->pArray = ppvVar16;
  pAVar14->vTemp = pVVar15;
  if ((int)local_c0 < 1) {
    local_60 = (Odc_Man_t *)0x0;
  }
  else {
    local_60 = Abc_NtkDontCareAlloc(iVar13,(int)local_c0,local_74,fVeryVerbose);
  }
  if (local_84 != 0) {
    Abc_NtkStartReverseLevels(local_a8,0);
  }
  if (local_a8->nObjCounts[8] != 0) {
    lVar25 = (long)local_a8->vBoxes->nSize;
    if (0 < lVar25) {
      ppvVar16 = local_a8->vBoxes->pArray;
      lVar26 = 0;
      do {
        pvVar37 = ppvVar16[lVar26];
        if ((*(uint *)((long)pvVar37 + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)pvVar37 + 8) = *(undefined8 *)((long)pvVar37 + 0x38);
        }
        lVar26 = lVar26 + 1;
      } while (lVar25 != lVar26);
    }
  }
  pAVar14->nNodesBeg = local_a8->nObjCounts[7];
  iVar13 = local_a8->vObjs->nSize;
  p_00 = Extra_ProgressBarStart(_stdout,iVar13);
  pVVar15 = local_a8->vObjs;
  if (pVVar15->nSize < 1) {
LAB_00302f64:
    Extra_ProgressBarStop(p_00);
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
    }
    pAVar14->timeTotal = lVar25 - local_68;
    pAVar14->nNodesEnd = local_a8->nObjCounts[7];
    if (local_74 != 0) {
      iVar13 = 0x98f3d2;
      printf("Used constants    = %6d.             ",(ulong)(uint)pAVar14->nUsedNodeC);
      Abc_Print(iVar13,"%s =","Cuts  ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeCut / 1000000.0);
      iVar13 = 0x98f3ff;
      printf("Used replacements = %6d.             ",(ulong)(uint)pAVar14->nUsedNode0);
      Abc_Print(iVar13,"%s =","Resub ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeRes / 1000000.0);
      iVar13 = 0x98f42c;
      printf("Used single ORs   = %6d.             ",(ulong)(uint)pAVar14->nUsedNode1Or);
      Abc_Print(iVar13,"%s ="," Div  ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeDiv / 1000000.0);
      iVar13 = 0x98f459;
      printf("Used single ANDs  = %6d.             ",(ulong)(uint)pAVar14->nUsedNode1And);
      Abc_Print(iVar13,"%s ="," Mffc ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeMffc / 1000000.0);
      iVar13 = 0x98f486;
      printf("Used double ORs   = %6d.             ",(ulong)(uint)pAVar14->nUsedNode2Or);
      Abc_Print(iVar13,"%s ="," Sim  ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeSim / 1000000.0);
      iVar13 = 0x98f4b3;
      printf("Used double ANDs  = %6d.             ",(ulong)(uint)pAVar14->nUsedNode2And);
      Abc_Print(iVar13,"%s ="," 1    ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeRes1 / 1000000.0);
      iVar13 = 0x98f4e0;
      printf("Used OR-AND       = %6d.             ",(ulong)(uint)pAVar14->nUsedNode2OrAnd);
      Abc_Print(iVar13,"%s ="," D    ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeResD / 1000000.0);
      iVar13 = 0x98f50d;
      printf("Used AND-OR       = %6d.             ",(ulong)(uint)pAVar14->nUsedNode2AndOr);
      Abc_Print(iVar13,"%s ="," 2    ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeRes2 / 1000000.0);
      iVar13 = 0x98f53a;
      printf("Used OR-2ANDs     = %6d.             ",(ulong)(uint)pAVar14->nUsedNode3OrAnd);
      Abc_Print(iVar13,"%s =","Truth ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeTruth / 1000000.0);
      iVar13 = 0x98f560;
      printf("Used AND-2ORs     = %6d.             ",(ulong)(uint)pAVar14->nUsedNode3AndOr);
      Abc_Print(iVar13,"%s =","AIG   ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeNtk / 1000000.0);
      iVar13 = 0x98f58d;
      printf("TOTAL             = %6d.             ",
             (ulong)(uint)(pAVar14->nUsedNode2AndOr + pAVar14->nUsedNode1And +
                           pAVar14->nUsedNode2And + pAVar14->nUsedNode0 +
                           pAVar14->nUsedNode2OrAnd + pAVar14->nUsedNode1Or +
                           pAVar14->nUsedNode2Or + pAVar14->nUsedNodeC + pAVar14->nUsedNode3OrAnd +
                          pAVar14->nUsedNode3AndOr));
      Abc_Print(iVar13,"%s =","TOTAL ");
      Abc_Print(iVar13,"%9.2f sec\n",(double)pAVar14->timeTotal / 1000000.0);
      printf("Total leaves   = %8d.\n",(ulong)(uint)pAVar14->nTotalLeaves);
      printf("Total divisors = %8d.\n",(ulong)(uint)pAVar14->nTotalDivs);
      printf("Gain           = %8d. (%6.2f %%).\n",
             ((double)(pAVar14->nNodesBeg - pAVar14->nNodesEnd) * 100.0) /
             (double)pAVar14->nNodesBeg);
    }
    pVVar15 = pAVar14->vDivs;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vSims;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs1UP;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs1UN;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs1B;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs2UP0;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs2UP1;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs2UN0;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vDivs2UN1;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    pVVar15 = pAVar14->vTemp;
    ppvVar16 = pVVar15->pArray;
    if (ppvVar16 != (void **)0x0) {
      free(ppvVar16);
    }
    free(pVVar15);
    if (pAVar14->pInfo != (uint *)0x0) {
      free(pAVar14->pInfo);
    }
    free(pAVar14);
    Abc_NtkManCutStop(local_48);
    if (local_60 != (Odc_Man_t *)0x0) {
      Abc_NtkDontCareFree(local_60);
    }
    pAVar32 = local_a8;
    pVVar15 = local_a8->vObjs;
    if (0 < pVVar15->nSize) {
      lVar25 = 0;
      do {
        if (pVVar15->pArray[lVar25] != (void *)0x0) {
          *(undefined8 *)((long)pVVar15->pArray[lVar25] + 0x38) = 0;
          pVVar15 = local_a8->vObjs;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < pVVar15->nSize);
    }
    if ((local_a8->nObjCounts[8] != 0) && (pVVar15 = local_a8->vBoxes, 0 < pVVar15->nSize)) {
      lVar25 = 0;
      do {
        pvVar37 = pVVar15->pArray[lVar25];
        if ((*(uint *)((long)pvVar37 + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)pvVar37 + 0x38) = *(undefined8 *)((long)pvVar37 + 8);
          *(undefined8 *)((long)pvVar37 + 8) = 0;
          pVVar15 = local_a8->vBoxes;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < pVVar15->nSize);
    }
    Abc_NtkReassignIds(local_a8);
    if (local_84 == 0) {
      Abc_NtkLevel(pAVar32);
    }
    else {
      Abc_NtkStopReverseLevels(pAVar32);
    }
    iVar13 = Abc_NtkCheck(pAVar32);
    if (iVar13 == 0) {
      puts("Abc_NtkRefactor: The network check has failed.");
      iVar13 = 0;
    }
    else {
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
      }
      s_ResubTime = lVar25 - local_68;
      iVar13 = 1;
    }
    return iVar13;
  }
  local_38 = (long)iVar13;
  lVar25 = 0;
  pAVar32 = local_a8;
  local_80 = p_00;
LAB_003019f9:
  pAVar31 = (Abc_Obj_t *)pVVar15->pArray[lVar25];
  if ((pAVar31 == (Abc_Obj_t *)0x0) || ((*(uint *)&pAVar31->field_0x14 & 0xf) != 7))
  goto LAB_00302b43;
  local_b8 = pAVar31;
  if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar25)) {
    Extra_ProgressBarUpdate_int(local_80,(int)lVar25,(char *)0x0);
    p_00 = local_80;
    pAVar32 = local_a8;
  }
  if (((ulong)local_b8 & 1) != 0) {
    __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_00303649:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
  }
  if (local_b8->pNtk->ntkType != ABC_NTK_STRASH) {
    __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
    goto LAB_00303649;
  }
  if ((local_b8->vFanins).nSize != 2) {
    __assert_fail("Abc_AigNodeIsAnd(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x193,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
  }
  if (((local_b8->field_0x15 & 2) != 0) || (1000 < (local_b8->vFanouts).nSize)) goto LAB_00302b43;
  if (lVar25 < local_38) {
    local_40 = lVar25;
    iVar13 = clock_gettime(3,&local_d0);
    p = local_60;
    if (iVar13 < 0) {
      lVar25 = 1;
    }
    else {
      lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
      lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
    }
    pVVar15 = Abc_NodeFindCut(local_48,local_b8,0);
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
    }
    pAVar14->timeCut = pAVar14->timeCut + lVar26 + lVar25;
    if (p != (Odc_Man_t *)0x0) {
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        lVar25 = 1;
      }
      else {
        lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
        lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
      }
      Abc_NtkDontCareClear(p);
      Abc_NtkDontCareCompute(p,local_b8,pVVar15,pAVar14->pCareSet);
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
      }
      pAVar14->timeTruth = pAVar14->timeTruth + lVar26 + lVar25;
    }
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      local_50 = 1;
    }
    else {
      lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
      local_50 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
    }
    if (local_84 == 0) {
      iVar13 = 1000000000;
    }
    else {
      iVar13 = Abc_ObjRequiredLevel(local_b8);
    }
    if ((int)local_94 < 0) {
      __assert_fail("nSteps >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                    ,0x753,
                    "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                   );
    }
    if (3 < local_94) {
      __assert_fail("nSteps <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                    ,0x754,
                    "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                   );
    }
    local_90 = CONCAT44(local_90._4_4_,iVar13);
    pAVar14->pRoot = local_b8;
    pAVar14->nLeaves = pVVar15->nSize;
    pAVar14->nLastGain = -1;
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      lVar25 = 1;
    }
    else {
      lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
      lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
    }
    iVar13 = Abc_NodeMffcInside(local_b8,pVVar15,pAVar14->vTemp);
    pAVar14->nMffc = iVar13;
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
    }
    pAVar14->timeMffc = pAVar14->timeMffc + lVar26 + lVar25;
    if (pAVar14->nMffc < 1) {
      __assert_fail("p->nMffc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                    ,0x75d,
                    "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                   );
    }
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      local_58 = 1;
    }
    else {
      lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
      local_58 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
    }
    pAVar14->vDivs1UP->nSize = 0;
    pAVar14->vDivs1UN->nSize = 0;
    pAVar14->vDivs1B->nSize = 0;
    pAVar14->vDivs->nSize = 0;
    pAVar32 = local_b8->pNtk;
    local_c0 = pVVar15;
    if ((pAVar32->vTravIds).pArray == (int *)0x0) {
      iVar13 = pAVar32->vObjs->nSize;
      uVar18 = (long)iVar13 + 500;
      iVar23 = (int)uVar18;
      if ((pAVar32->vTravIds).nCap < iVar23) {
        piVar19 = (int *)malloc(uVar18 * 4);
        (pAVar32->vTravIds).pArray = piVar19;
        if (piVar19 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar32->vTravIds).nCap = iVar23;
      }
      else {
        piVar19 = (int *)0x0;
      }
      if (-500 < iVar13) {
        memset(piVar19,0,(uVar18 & 0xffffffff) << 2);
      }
      (pAVar32->vTravIds).nSize = iVar23;
    }
    iVar13 = pAVar32->nTravIds;
    pAVar32->nTravIds = iVar13 + 1;
    if (0x3ffffffe < iVar13) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    if (0 < local_c0->nSize) {
      lVar25 = 0;
      do {
        plVar8 = (long *)local_c0->pArray[lVar25];
        pVVar15 = pAVar14->vDivs;
        uVar22 = pVVar15->nSize;
        if (uVar22 == pVVar15->nCap) {
          if ((int)uVar22 < 0x10) {
            if (pVVar15->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc(0x80);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
            }
            pVVar15->pArray = ppvVar16;
            pVVar15->nCap = 0x10;
          }
          else {
            if (pVVar15->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar22 << 4);
            }
            pVVar15->pArray = ppvVar16;
            pVVar15->nCap = uVar22 * 2;
          }
        }
        else {
          ppvVar16 = pVVar15->pArray;
        }
        iVar13 = pVVar15->nSize;
        iVar23 = iVar13 + 1;
        pVVar15->nSize = iVar23;
        ppvVar16[iVar13] = plVar8;
        lVar26 = *plVar8;
        iVar13 = (int)plVar8[2];
        uVar7 = *(undefined4 *)(lVar26 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar13 + 1,iVar23);
        if (((long)iVar13 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar13)) {
LAB_003035dc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar26 + 0xe8) + (long)iVar13 * 4) = uVar7;
        lVar25 = lVar25 + 1;
      } while (lVar25 < local_c0->nSize);
    }
    pVVar39 = local_c0;
    pVVar15 = pAVar14->vTemp;
    if (0 < pVVar15->nSize) {
      lVar25 = 0;
      do {
        puVar17 = (uint *)((long)pVVar15->pArray[lVar25] + 0x14);
        *puVar17 = *puVar17 | 0x10;
        lVar25 = lVar25 + 1;
        pVVar15 = pAVar14->vTemp;
      } while (lVar25 < pVVar15->nSize);
    }
    Abc_ManResubCollectDivs_rec(local_b8,pAVar14->vDivs);
    pVVar15 = pAVar14->vTemp;
    iVar13 = pVVar15->nSize;
    if (0 < iVar13) {
      lVar25 = 0;
      do {
        puVar17 = (uint *)((long)pVVar15->pArray[lVar25] + 0x14);
        *puVar17 = *puVar17 & 0xffffffef;
        lVar25 = lVar25 + 1;
        pVVar15 = pAVar14->vTemp;
        iVar13 = pVVar15->nSize;
      } while (lVar25 < iVar13);
    }
    pVVar15 = pAVar14->vDivs;
    uVar22 = pVVar15->nSize;
    iVar13 = (uVar22 - pVVar39->nSize) + iVar13;
    local_70 = pAVar14->vSims->nSize;
    if (iVar13 < local_70 - pAVar14->nLeavesMax) {
      if (0 < (int)uVar22) {
        local_70 = local_70 - (iVar13 + pAVar14->nLeavesMax);
        piVar19 = (int *)0x0;
        local_6c = 0;
        iVar13 = (int)local_90;
LAB_00301ff7:
        plVar8 = (long *)pVVar15->pArray[(long)piVar19];
        local_b0 = piVar19;
        if (*(int *)((long)plVar8 + 0x2c) - 1U < 100) {
          lVar25 = 0;
LAB_00302015:
          plVar9 = *(long **)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                             (long)*(int *)(plVar8[6] + lVar25 * 4) * 8);
          lVar26 = *plVar9;
          iVar23 = (int)plVar9[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar23 + 1,(int)piVar19);
          if (((long)iVar23 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar23)) goto LAB_003035bd;
          piVar19 = extraout_RDX;
          if (*(int *)(*(long *)(lVar26 + 0xe8) + (long)iVar23 * 4) != *(int *)(*plVar9 + 0xd8)) {
            uVar22 = *(uint *)((long)plVar9 + 0x14) >> 0xc;
            piVar19 = (int *)(ulong)uVar22;
            if (((int)uVar22 <= iVar13) && (1 < (*(uint *)((long)plVar9 + 0x14) & 0xf) - 3)) {
              plVar10 = *(long **)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                                  (long)*(int *)plVar9[4] * 8);
              lVar26 = *plVar10;
              iVar13 = (int)plVar10[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar13 + 1,uVar22);
              if (((long)iVar13 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar13)) {
LAB_003035bd:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar19 = extraout_RDX_00;
              if (*(int *)(*(long *)(lVar26 + 0xe8) + (long)iVar13 * 4) == *(int *)(*plVar10 + 0xd8)
                 ) {
                plVar10 = *(long **)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                                    (long)*(int *)(plVar9[4] + 4) * 8);
                lVar26 = *plVar10;
                iVar13 = (int)plVar10[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar13 + 1,(int)extraout_RDX_00);
                if (((long)iVar13 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar13)) goto LAB_003035bd;
                piVar19 = extraout_RDX_01;
                if (*(int *)(*(long *)(lVar26 + 0xe8) + (long)iVar13 * 4) ==
                    *(int *)(*plVar10 + 0xd8)) {
                  piVar19 = (int *)(long)*(int *)plVar9[4];
                  lVar26 = *(long *)(*(long *)(*plVar9 + 0x20) + 8);
                  iVar13 = (int)local_90;
                  if ((*(Abc_Obj_t **)(lVar26 + (long)piVar19 * 8) != local_b8) &&
                     (*(Abc_Obj_t **)(lVar26 + (long)((int *)plVar9[4])[1] * 8) != local_b8)) {
                    pVVar15 = local_a0->vDivs;
                    uVar22 = pVVar15->nSize;
                    if (uVar22 == pVVar15->nCap) {
                      if ((int)uVar22 < 0x10) {
                        if (pVVar15->pArray == (void **)0x0) {
                          ppvVar16 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
                        }
                        pVVar15->pArray = ppvVar16;
                        pVVar15->nCap = 0x10;
                      }
                      else {
                        if (pVVar15->pArray == (void **)0x0) {
                          ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
                        }
                        else {
                          ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar22 << 4);
                        }
                        pVVar15->pArray = ppvVar16;
                        pVVar15->nCap = uVar22 * 2;
                      }
                    }
                    else {
                      ppvVar16 = pVVar15->pArray;
                    }
                    iVar23 = pVVar15->nSize;
                    Fill = iVar23 + 1;
                    pVVar15->nSize = Fill;
                    ppvVar16[iVar23] = plVar9;
                    lVar26 = *plVar9;
                    iVar23 = (int)plVar9[2];
                    uVar7 = *(undefined4 *)(lVar26 + 0xd8);
                    Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar23 + 1,Fill);
                    if (((long)iVar23 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar23))
                    goto LAB_003035dc;
                    *(undefined4 *)(*(long *)(lVar26 + 0xe8) + (long)iVar23 * 4) = uVar7;
                    local_6c = local_6c + 1;
                    piVar19 = extraout_RDX_02;
                    if (local_6c != local_70) goto LAB_003021af;
                    pVVar15 = local_a0->vDivs;
                    uVar22 = pVVar15->nSize;
                    pAVar14 = local_a0;
                    pVVar39 = local_c0;
                    goto LAB_003022af;
                  }
                  goto LAB_003021af;
                }
              }
              iVar13 = (int)local_90;
            }
          }
LAB_003021af:
          lVar25 = lVar25 + 1;
          if (*(int *)((long)plVar8 + 0x2c) <= lVar25) goto LAB_00302279;
          goto LAB_00302015;
        }
        goto LAB_00302287;
      }
LAB_003022af:
      pAVar14->nDivs = uVar22;
      pVVar24 = pAVar14->vTemp;
      if (0 < pVVar24->nSize) {
        lVar25 = 0;
        do {
          pvVar37 = pVVar24->pArray[lVar25];
          pVVar15 = pAVar14->vDivs;
          uVar22 = pVVar15->nSize;
          if (uVar22 == pVVar15->nCap) {
            if ((int)uVar22 < 0x10) {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar16 = (void **)malloc(0x80);
              }
              else {
                ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
              }
              pVVar15->pArray = ppvVar16;
              pVVar15->nCap = 0x10;
            }
            else {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
              }
              else {
                ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar22 << 4);
              }
              pVVar15->pArray = ppvVar16;
              pVVar15->nCap = uVar22 * 2;
            }
          }
          else {
            ppvVar16 = pVVar15->pArray;
          }
          iVar13 = pVVar15->nSize;
          pVVar15->nSize = iVar13 + 1;
          ppvVar16[iVar13] = pvVar37;
          lVar25 = lVar25 + 1;
          pVVar24 = pAVar14->vTemp;
        } while (lVar25 < pVVar24->nSize);
        pVVar15 = pAVar14->vDivs;
        uVar22 = pVVar15->nSize;
        pVVar39 = local_c0;
      }
      if ((int)uVar22 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      if ((Abc_Obj_t *)pVVar15->pArray[(ulong)uVar22 - 1] != local_b8) {
        __assert_fail("pRoot == Vec_PtrEntryLast(p->vDivs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x1f5,
                      "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)");
      }
      if (pAVar14->vSims->nSize - pAVar14->nLeavesMax < (int)(uVar22 - pVVar39->nSize)) {
        __assert_fail("Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) <= Vec_PtrSize(p->vSims) - p->nLeavesMax"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x1f7,
                      "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)");
      }
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
      }
      pAVar14->timeDiv = pAVar14->timeDiv + lVar25 + local_58;
      uVar2 = pAVar14->nLeaves;
      uVar4 = pAVar14->nDivs;
      uVar3 = pAVar14->nTotalDivs;
      uVar5 = pAVar14->nTotalLeaves;
      pAVar14->nTotalDivs = uVar3 + uVar4;
      pAVar14->nTotalLeaves = uVar5 + uVar2;
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        lVar25 = 1;
      }
      else {
        lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
        lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
      }
      pVVar15 = pAVar14->vDivs;
      iVar13 = pAVar14->nLeaves;
      pVVar39 = pAVar14->vSims;
      iVar23 = pAVar14->nLeavesMax;
      if (pVVar39->nSize - iVar23 < pVVar15->nSize - iVar13) {
        __assert_fail("Vec_PtrSize(vDivs) - nLeaves <= Vec_PtrSize(vSims) - nLeavesMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x23d,"void Abc_ManResubSimulate(Vec_Ptr_t *, int, Vec_Ptr_t *, int, int)");
      }
      if (0 < pVVar15->nSize) {
        uVar22 = pAVar14->nWords;
        uVar18 = (ulong)uVar22;
        lVar26 = 0;
        do {
          plVar8 = (long *)pVVar15->pArray[lVar26];
          if (lVar26 < iVar13) {
            if (pVVar39->nSize <= lVar26) goto LAB_003035fb;
            plVar8[7] = (long)pVVar39->pArray[lVar26];
          }
          else {
            lVar28 = (lVar26 - iVar13) + (long)iVar23;
            if ((lVar28 < 0) || (pVVar39->nSize <= lVar28)) goto LAB_003035fb;
            pvVar37 = pVVar39->pArray[lVar28];
            plVar8[7] = (long)pvVar37;
            lVar28 = *(long *)(*(long *)(*plVar8 + 0x20) + 8);
            lVar11 = *(long *)(*(long *)(lVar28 + (long)*(int *)plVar8[4] * 8) + 0x38);
            lVar28 = *(long *)(*(long *)(lVar28 + (long)((int *)plVar8[4])[1] * 8) + 0x38);
            uVar38 = *(uint *)((long)plVar8 + 0x14);
            if ((uVar38 >> 10 & 1) == 0) {
              if ((uVar38 >> 0xb & 1) == 0) {
                if (0 < (int)uVar22) {
                  uVar30 = 0;
                  do {
                    *(uint *)((long)pvVar37 + uVar30 * 4) =
                         *(uint *)(lVar28 + uVar30 * 4) & *(uint *)(lVar11 + uVar30 * 4);
                    uVar30 = uVar30 + 1;
                  } while (uVar18 != uVar30);
                }
              }
              else if (0 < (int)uVar22) {
                uVar30 = 0;
                do {
                  *(uint *)((long)pvVar37 + uVar30 * 4) =
                       ~*(uint *)(lVar28 + uVar30 * 4) & *(uint *)(lVar11 + uVar30 * 4);
                  uVar30 = uVar30 + 1;
                } while (uVar18 != uVar30);
              }
            }
            else if ((uVar38 >> 0xb & 1) == 0) {
              if (0 < (int)uVar22) {
                uVar30 = 0;
                do {
                  *(uint *)((long)pvVar37 + uVar30 * 4) =
                       ~*(uint *)(lVar11 + uVar30 * 4) & *(uint *)(lVar28 + uVar30 * 4);
                  uVar30 = uVar30 + 1;
                } while (uVar18 != uVar30);
              }
            }
            else if (0 < (int)uVar22) {
              uVar30 = 0;
              do {
                *(uint *)((long)pvVar37 + uVar30 * 4) =
                     ~(*(uint *)(lVar28 + uVar30 * 4) | *(uint *)(lVar11 + uVar30 * 4));
                uVar30 = uVar30 + 1;
              } while (uVar18 != uVar30);
            }
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < pVVar15->nSize);
        if (0 < pVVar15->nSize) {
          lVar26 = 0;
          do {
            pvVar37 = pVVar15->pArray[lVar26];
            puVar17 = *(uint **)((long)pvVar37 + 0x38);
            uVar38 = *puVar17;
            *(uint *)((long)pvVar37 + 0x14) =
                 *(uint *)((long)pvVar37 + 0x14) & 0xffffff7f | (uVar38 & 1) << 7;
            if ((0 < (int)uVar22) && ((uVar38 & 1) != 0)) {
              uVar30 = 0;
              do {
                puVar1 = puVar17 + uVar30;
                *puVar1 = ~*puVar1;
                uVar30 = uVar30 + 1;
              } while (uVar18 != uVar30);
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 < pVVar15->nSize);
        }
      }
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
      }
      pAVar14->timeSim = pAVar14->timeSim + lVar26 + lVar25;
      iVar13 = clock_gettime(3,&local_d0);
      if (iVar13 < 0) {
        pVVar15 = (Vec_Ptr_t *)0x1;
      }
      else {
        lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
        pVVar15 = (Vec_Ptr_t *)(((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000);
      }
      pAVar31 = pAVar14->pRoot;
      uVar22 = pAVar14->nWords;
      if ((int)uVar22 < 1) {
        uVar18 = 0;
LAB_003026d2:
        if ((uint)uVar18 == uVar22) goto LAB_003026d7;
        local_c0 = pVVar15;
        if (0 < (long)pAVar14->nDivs) {
          uVar38 = pAVar14->vDivs->nSize;
          if ((int)uVar38 < 1) {
            uVar38 = 0;
          }
          uVar18 = 0;
          do {
            if (uVar18 == uVar38) goto LAB_003035fb;
            pAVar29 = (Abc_Obj_t *)pAVar14->vDivs->pArray[uVar18];
            if ((int)uVar22 < 1) {
              uVar30 = 0;
            }
            else {
              uVar30 = 0;
              while ((pAVar14->pCareSet[uVar30] &
                     (*(uint *)((long)(pAVar31->field_5).pData + uVar30 * 4) ^
                     *(uint *)((long)(pAVar29->field_5).pData + uVar30 * 4))) == 0) {
                uVar30 = uVar30 + 1;
                if (uVar22 == uVar30) goto LAB_00302785;
              }
            }
            if ((uint)uVar30 == uVar22) {
LAB_00302785:
              pGraph_00 = Abc_ManResubQuit0(pAVar31,pAVar29);
              if (pGraph_00 != (Dec_Graph_t *)0x0) {
                iVar13 = clock_gettime(3,&local_d0);
                if (iVar13 < 0) {
                  lVar25 = -1;
                }
                else {
                  lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
                }
                pAVar14->timeRes1 = (long)&local_c0->nCap + pAVar14->timeRes1 + lVar25;
                pAVar14->nUsedNode0 = pAVar14->nUsedNode0 + 1;
                goto LAB_00302705;
              }
              break;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != (long)pAVar14->nDivs);
        }
        if ((local_94 == 0) || (pAVar14->nMffc == 1)) {
          iVar13 = clock_gettime(3,&local_d0);
          if (iVar13 < 0) {
            lVar25 = -1;
          }
          else {
            lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
          }
          pAVar14->timeRes1 = (long)&local_c0->nCap + pAVar14->timeRes1 + lVar25;
          goto LAB_003029f3;
        }
        pVVar15 = pAVar14->vDivs1UP;
        pVVar15->nSize = 0;
        pAVar14->vDivs1UN->nSize = 0;
        pAVar14->vDivs1B->nSize = 0;
        pAVar31 = pAVar14->pRoot;
        pvVar37 = (pAVar31->field_5).pData;
        iVar13 = pAVar14->nDivs;
        if (0 < iVar13) {
          lVar25 = 0;
LAB_00302858:
          if (pAVar14->vDivs->nSize <= lVar25) {
LAB_003035fb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar27 = pAVar14->vDivs->pArray[lVar25];
          if ((int)(*(uint *)((long)pvVar27 + 0x14) >> 0xc) < (int)local_90) {
            iVar13 = pAVar14->nWords;
            lVar26 = (long)iVar13;
            if (lVar26 < 1) {
              lVar28 = 0;
              if (iVar13 == 0) goto LAB_003028c0;
LAB_003028b2:
              if ((int)lVar28 != iVar13) {
                pVVar15 = pAVar14->vDivs1B;
                goto LAB_003028f6;
              }
              goto LAB_003028b6;
            }
            lVar11 = *(long *)((long)pvVar27 + 0x38);
            puVar17 = pAVar14->pCareSet;
            lVar28 = 0;
            do {
              if ((puVar17[lVar28] &
                  ~*(uint *)((long)pvVar37 + lVar28 * 4) & *(uint *)(lVar11 + lVar28 * 4)) != 0) {
                if (iVar13 != (int)lVar28) {
                  lVar28 = 0;
                  goto LAB_003028c8;
                }
                break;
              }
              lVar28 = lVar28 + 1;
            } while (lVar26 != lVar28);
LAB_003028c0:
            pVVar15 = pAVar14->vDivs1UP;
            goto LAB_003028f6;
          }
          goto LAB_00302983;
        }
        goto LAB_00302b8a;
      }
      uVar18 = 0;
      do {
        if ((*(uint *)((long)(pAVar31->field_5).pData + uVar18 * 4) & pAVar14->pCareSet[uVar18]) !=
            0) goto LAB_003026d2;
        uVar18 = uVar18 + 1;
      } while (uVar22 != uVar18);
LAB_003026d7:
      cVar6 = pAVar31->field_0x14;
      pGraph_00 = (Dec_Graph_t *)calloc(1,0x20);
      pGraph_00->fConst = 1;
      if (-1 < cVar6) {
        pGraph_00->eRoot = (Dec_Edge_t)0x1;
      }
      pAVar14->nUsedNodeC = pAVar14->nUsedNodeC + 1;
LAB_00302705:
      iVar13 = pAVar14->nMffc;
      goto LAB_00302709;
    }
    goto LAB_003029f3;
  }
  goto LAB_00302f64;
LAB_00302279:
  pVVar15 = local_a0->vDivs;
  pAVar14 = local_a0;
  pVVar39 = local_c0;
LAB_00302287:
  piVar19 = (int *)((long)local_b0 + 1);
  uVar22 = pVVar15->nSize;
  if ((long)(int)uVar22 <= (long)piVar19) goto LAB_003022af;
  goto LAB_00301ff7;
  while (lVar28 = lVar28 + 1, lVar26 != lVar28) {
LAB_003028c8:
    if ((puVar17[lVar28] & ~(*(uint *)((long)pvVar37 + lVar28 * 4) | *(uint *)(lVar11 + lVar28 * 4))
        ) != 0) {
      if (iVar13 != (int)lVar28) {
        lVar28 = 0;
        goto LAB_00302999;
      }
      break;
    }
  }
  pVVar15 = pAVar14->vDivs1UP;
  goto LAB_003028f2;
  while (lVar28 = lVar28 + 1, lVar26 != lVar28) {
LAB_00302999:
    if ((puVar17[lVar28] & ~*(uint *)(lVar11 + lVar28 * 4) & *(uint *)((long)pvVar37 + lVar28 * 4))
        != 0) {
      if (iVar13 != (int)lVar28) {
        lVar28 = 0;
        goto LAB_003029c0;
      }
      break;
    }
  }
  pVVar15 = pAVar14->vDivs1UN;
  goto LAB_003028f6;
  while (lVar28 = lVar28 + 1, lVar26 != lVar28) {
LAB_003029c0:
    if ((puVar17[lVar28] & *(uint *)((long)pvVar37 + lVar28 * 4) & *(uint *)(lVar11 + lVar28 * 4))
        != 0) goto LAB_003028b2;
  }
LAB_003028b6:
  pVVar15 = pAVar14->vDivs1UN;
LAB_003028f2:
  pvVar27 = (void *)((ulong)pvVar27 ^ 1);
LAB_003028f6:
  piVar19 = &pVVar15->nSize;
  uVar22 = pVVar15->nSize;
  if (uVar22 == pVVar15->nCap) {
    if ((int)uVar22 < 0x10) {
      if (pVVar15->pArray == (void **)0x0) {
        ppvVar16 = (void **)malloc(0x80);
      }
      else {
        ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
      }
      pVVar15->pArray = ppvVar16;
      pVVar15->nCap = 0x10;
    }
    else {
      local_b0 = piVar19;
      if (pVVar15->pArray == (void **)0x0) {
        ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
      }
      else {
        ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar22 << 4);
      }
      pVVar15->pArray = ppvVar16;
      pVVar15->nCap = uVar22 * 2;
      piVar19 = local_b0;
    }
  }
  else {
    ppvVar16 = pVVar15->pArray;
  }
  iVar13 = *piVar19;
  *piVar19 = iVar13 + 1;
  ppvVar16[iVar13] = pvVar27;
  iVar13 = pAVar14->nDivs;
LAB_00302983:
  lVar25 = lVar25 + 1;
  if (iVar13 <= lVar25) goto LAB_00302b7e;
  goto LAB_00302858;
LAB_00302b7e:
  pAVar31 = pAVar14->pRoot;
  pVVar15 = pAVar14->vDivs1UP;
  pvVar37 = (pAVar31->field_5).pData;
LAB_00302b8a:
  pAVar12 = local_a0;
  uVar18 = (ulong)pVVar15->nSize;
  if (0 < (long)uVar18) {
    uVar33 = 1;
    uVar30 = 0;
    do {
      uVar34 = uVar30 + 1;
      if (uVar34 < uVar18) {
        pAVar29 = (Abc_Obj_t *)pVVar15->pArray[uVar30];
        lVar25 = *(long *)(((ulong)pAVar29 & 0xfffffffffffffffe) + 0x38);
        uVar22 = pAVar14->nWords;
        uVar35 = (ulong)uVar22;
        uVar30 = uVar33;
        do {
          pObj1 = (Abc_Obj_t *)pVVar15->pArray[uVar30];
          lVar26 = *(long *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x38);
          if (((ulong)pAVar29 & 1) == 0) {
            if (((ulong)pObj1 & 1) == 0) {
              if ((int)uVar22 < 1) {
LAB_00302ca6:
                uVar36 = 0;
              }
              else {
                uVar36 = 0;
                while ((pAVar14->pCareSet[uVar36] &
                       ((*(uint *)(lVar26 + uVar36 * 4) | *(uint *)(lVar25 + uVar36 * 4)) ^
                       *(uint *)((long)pvVar37 + uVar36 * 4))) == 0) {
                  uVar36 = uVar36 + 1;
                  if (uVar35 == uVar36) goto LAB_00302d9d;
                }
              }
            }
            else {
              if ((int)uVar22 < 1) goto LAB_00302ca6;
              uVar36 = 0;
              while ((pAVar14->pCareSet[uVar36] &
                     ((~*(uint *)(lVar26 + uVar36 * 4) | *(uint *)(lVar25 + uVar36 * 4)) ^
                     *(uint *)((long)pvVar37 + uVar36 * 4))) == 0) {
                uVar36 = uVar36 + 1;
                if (uVar35 == uVar36) goto LAB_00302d9d;
              }
            }
          }
          else if (((ulong)pObj1 & 1) == 0) {
            if ((int)uVar22 < 1) goto LAB_00302ca6;
            uVar36 = 0;
            while ((pAVar14->pCareSet[uVar36] &
                   ((~*(uint *)(lVar25 + uVar36 * 4) | *(uint *)(lVar26 + uVar36 * 4)) ^
                   *(uint *)((long)pvVar37 + uVar36 * 4))) == 0) {
              uVar36 = uVar36 + 1;
              if (uVar35 == uVar36) goto LAB_00302d9d;
            }
          }
          else {
            if ((int)uVar22 < 1) goto LAB_00302ca6;
            uVar36 = 0;
            while ((pAVar14->pCareSet[uVar36] &
                   ~(*(uint *)(lVar26 + uVar36 * 4) & *(uint *)(lVar25 + uVar36 * 4) ^
                    *(uint *)((long)pvVar37 + uVar36 * 4))) == 0) {
              uVar36 = uVar36 + 1;
              if (uVar35 == uVar36) goto LAB_00302d9d;
            }
          }
          if ((uint)uVar36 == uVar22) {
LAB_00302d9d:
            local_a0->nUsedNode1Or = local_a0->nUsedNode1Or + 1;
            iVar13 = 1;
            goto LAB_00302dbe;
          }
          uVar30 = uVar30 + 1;
          pAVar14 = local_a0;
        } while (uVar30 != uVar18);
      }
      uVar33 = uVar33 + 1;
      uVar30 = uVar34;
    } while (uVar34 != uVar18);
  }
  uVar18 = (ulong)pAVar14->vDivs1UN->nSize;
  if (0 < (long)uVar18) {
    ppvVar16 = pAVar14->vDivs1UN->pArray;
    uVar33 = 1;
    uVar30 = 0;
    do {
      uVar34 = uVar30 + 1;
      if (uVar34 < uVar18) {
        pAVar29 = (Abc_Obj_t *)ppvVar16[uVar30];
        lVar25 = *(long *)(((ulong)pAVar29 & 0xfffffffffffffffe) + 0x38);
        uVar22 = pAVar14->nWords;
        uVar30 = uVar33;
LAB_00302d12:
        pObj1 = (Abc_Obj_t *)ppvVar16[uVar30];
        lVar26 = *(long *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x38);
        if (((ulong)pObj1 & 1) == 0) {
          if ((int)uVar22 < 1) {
LAB_00302d7a:
            uVar35 = 0;
          }
          else {
            uVar35 = 0;
            while ((pAVar14->pCareSet[uVar35] &
                   (*(uint *)(lVar26 + uVar35 * 4) & *(uint *)(lVar25 + uVar35 * 4) ^
                   *(uint *)((long)pvVar37 + uVar35 * 4))) == 0) {
              uVar35 = uVar35 + 1;
              if (uVar22 == uVar35) goto LAB_00302db0;
            }
          }
        }
        else {
          if ((int)uVar22 < 1) goto LAB_00302d7a;
          uVar35 = 0;
          while ((pAVar14->pCareSet[uVar35] &
                 (~*(uint *)(lVar26 + uVar35 * 4) & *(uint *)(lVar25 + uVar35 * 4) ^
                 *(uint *)((long)pvVar37 + uVar35 * 4))) == 0) {
            uVar35 = uVar35 + 1;
            if (uVar22 == uVar35) goto LAB_00302db0;
          }
        }
        if ((uint)uVar35 != uVar22) goto code_r0x00302d82;
LAB_00302db0:
        local_a0->nUsedNode1And = local_a0->nUsedNode1And + 1;
        iVar13 = 0;
LAB_00302dbe:
        pGraph_00 = Abc_ManResubQuit1(pAVar31,pAVar29,pObj1,iVar13);
        pAVar14 = pAVar12;
        if (pGraph_00 == (Dec_Graph_t *)0x0) break;
        iVar13 = clock_gettime(3,&local_d0);
        if (iVar13 < 0) {
          lVar25 = -1;
        }
        else {
          lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
        }
        pAVar12->timeRes1 = (long)&local_c0->nCap + pAVar12->timeRes1 + lVar25;
        iVar13 = pAVar12->nMffc + -1;
        goto LAB_00302709;
      }
LAB_00302d8f:
      uVar33 = uVar33 + 1;
      uVar30 = uVar34;
    } while (uVar34 != uVar18);
  }
  iVar13 = clock_gettime(3,&local_d0);
  if (iVar13 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
  }
  pAVar14->timeRes1 = (long)&local_c0->nCap + pAVar14->timeRes1 + lVar25;
  if ((local_94 == 1) || (pAVar14->nMffc == 2)) goto LAB_003029f3;
  aVar20 = Abc_Clock();
  iVar13 = (int)local_90;
  pGraph_00 = Abc_ManResubDivs12(pAVar14,(int)local_90);
  aVar21 = Abc_Clock();
  pAVar14->timeRes2 = pAVar14->timeRes2 + (aVar21 - aVar20);
  if (pGraph_00 == (Dec_Graph_t *)0x0) {
    aVar20 = Abc_Clock();
    Abc_ManResubDivsD(pAVar14,iVar13);
    aVar21 = Abc_Clock();
    pAVar14->timeResD = pAVar14->timeResD + (aVar21 - aVar20);
    aVar20 = Abc_Clock();
    pGraph_00 = Abc_ManResubDivs2(pAVar14,iVar13);
    aVar21 = Abc_Clock();
    pAVar14->timeRes2 = pAVar14->timeRes2 + (aVar21 - aVar20);
    if (pGraph_00 != (Dec_Graph_t *)0x0) goto LAB_00302f0b;
    if ((local_94 == 2) || (pAVar14->nMffc == 3)) {
LAB_003029f3:
      pGraph_00 = (Dec_Graph_t *)0x0;
      goto LAB_003029f6;
    }
    aVar20 = Abc_Clock();
    pGraph_00 = Abc_ManResubDivs3(pAVar14,iVar13);
    aVar21 = Abc_Clock();
    pAVar14->timeRes3 = pAVar14->timeRes3 + (aVar21 - aVar20);
    if (pGraph_00 == (Dec_Graph_t *)0x0) goto LAB_003029f3;
    iVar13 = pAVar14->nMffc + -3;
  }
  else {
LAB_00302f0b:
    iVar13 = pAVar14->nMffc + -2;
  }
LAB_00302709:
  pAVar14->nLastGain = iVar13;
LAB_003029f6:
  iVar13 = clock_gettime(3,&local_d0);
  if (iVar13 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
  }
  pAVar14->timeRes = pAVar14->timeRes + lVar25 + local_50;
  lVar25 = local_40;
  p_00 = local_80;
  pAVar32 = local_a8;
  if (pGraph_00 != (Dec_Graph_t *)0x0) {
    pAVar14->nTotalGain = pAVar14->nTotalGain + pAVar14->nLastGain;
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      lVar25 = 1;
    }
    else {
      lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
      lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_d0.tv_sec * -1000000;
    }
    Dec_GraphUpdateNetwork(local_b8,pGraph_00,local_84,pAVar14->nLastGain);
    iVar13 = clock_gettime(3,&local_d0);
    if (iVar13 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = local_d0.tv_nsec / 1000 + local_d0.tv_sec * 1000000;
    }
    pAVar14->timeNtk = pAVar14->timeNtk + lVar26 + lVar25;
    if (pGraph_00->pNodes != (Dec_Node_t *)0x0) {
      free(pGraph_00->pNodes);
    }
    free(pGraph_00);
    lVar25 = local_40;
    p_00 = local_80;
    pAVar32 = local_a8;
  }
LAB_00302b43:
  lVar25 = lVar25 + 1;
  pVVar15 = pAVar32->vObjs;
  if (pVVar15->nSize <= lVar25) goto LAB_00302f64;
  goto LAB_003019f9;
code_r0x00302d82:
  uVar30 = uVar30 + 1;
  pAVar14 = local_a0;
  if (uVar30 == uVar18) goto LAB_00302d8f;
  goto LAB_00302d12;
}

Assistant:

int Abc_NtkResubstitute( Abc_Ntk_t * pNtk, int nCutMax, int nStepsMax, int nLevelsOdc, int fUpdateLevel, int fVerbose, int fVeryVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRes_t * pManRes;
    Abc_ManCut_t * pManCut;
    Odc_Man_t * pManOdc = NULL;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );

    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nCutMax, 100000, 100000, 100000 );
    pManRes = Abc_ManResubStart( nCutMax, ABC_RS_DIV1_MAX );
    if ( nLevelsOdc > 0 )
    pManOdc = Abc_NtkDontCareAlloc( nCutMax, nLevelsOdc, fVerbose, fVeryVerbose );

    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pNext = (Abc_Obj_t *)pNode->pData;
    }

    // resynthesize each node once
    pManRes->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;

        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vLeaves = Abc_NodeFindCut( pManCut, pNode, 0 );
//        vLeaves = Abc_CutFactorLarge( pNode, nCutMax );
pManRes->timeCut += Abc_Clock() - clk;
/*
        if ( fVerbose && vLeaves )
        printf( "Node %6d : Leaves = %3d. Volume = %3d.\n", pNode->Id, Vec_PtrSize(vLeaves), Abc_CutVolumeCheck(pNode, vLeaves) );
        if ( vLeaves == NULL )
            continue;
*/
        // get the don't-cares
        if ( pManOdc )
        {
clk = Abc_Clock();
            Abc_NtkDontCareClear( pManOdc );
            Abc_NtkDontCareCompute( pManOdc, pNode, vLeaves, pManRes->pCareSet );
pManRes->timeTruth += Abc_Clock() - clk;
        }

        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_ManResubEval( pManRes, pNode, vLeaves, nStepsMax, fUpdateLevel, fVerbose );
//        Vec_PtrFree( vLeaves );
//        Abc_ManResubCleanup( pManRes );
pManRes->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        pManRes->nTotalGain += pManRes->nLastGain;
/*
        if ( pManRes->nLeaves == 4 && pManRes->nMffc == 2 && pManRes->nLastGain == 1 )
        {
            printf( "%6d :  L = %2d. V = %2d. Mffc = %2d. Divs = %3d.   Up = %3d. Un = %3d. B = %3d.\n", 
                   pNode->Id, pManRes->nLeaves, Abc_CutVolumeCheck(pNode, vLeaves), pManRes->nMffc, pManRes->nDivs, 
                   pManRes->vDivs1UP->nSize, pManRes->vDivs1UN->nSize, pManRes->vDivs1B->nSize );
            Abc_ManResubPrintDivs( pManRes, pNode, vLeaves );
        }
*/
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRes->nLastGain );
pManRes->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRes->timeTotal = Abc_Clock() - clkStart;
    pManRes->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics
    if ( fVerbose )
    Abc_ManResubPrint( pManRes );

    // delete the managers
    Abc_ManResubStop( pManRes );
    Abc_NtkManCutStop( pManCut );
    if ( pManOdc ) Abc_NtkDontCareFree( pManOdc );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->pData = NULL;

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pData = pNode->pNext, pNode->pNext = NULL;
    }

    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
s_ResubTime = Abc_Clock() - clkStart;
    return 1;
}